

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect.c
# Opt level: O1

void print_externtype(wasm_externtype_t *type)

{
  undefined1 uVar1;
  wasm_mutability_t mut;
  wasm_valtype_vec_t *pwVar2;
  wasm_valtype_t *type_00;
  undefined8 uVar3;
  wasm_limits_t *pwVar4;
  
  uVar1 = wasm_externtype_kind();
  switch(uVar1) {
  case 0:
    uVar3 = wasm_externtype_as_functype_const(type);
    printf("func ");
    pwVar2 = (wasm_valtype_vec_t *)wasm_functype_params(uVar3);
    print_valtypes(pwVar2);
    printf(" -> ");
    pwVar2 = (wasm_valtype_vec_t *)wasm_functype_results(uVar3);
    print_valtypes(pwVar2);
    return;
  case 1:
    uVar3 = wasm_externtype_as_globaltype_const(type);
    printf("global ");
    mut = wasm_globaltype_mutability(uVar3);
    print_mutability(mut);
    putchar(0x20);
    type_00 = (wasm_valtype_t *)wasm_globaltype_content(uVar3);
    break;
  case 2:
    uVar3 = wasm_externtype_as_tabletype_const(type);
    printf("table ");
    pwVar4 = (wasm_limits_t *)wasm_tabletype_limits(uVar3);
    print_limits(pwVar4);
    putchar(0x20);
    type_00 = (wasm_valtype_t *)wasm_tabletype_element(uVar3);
    break;
  case 3:
    uVar3 = wasm_externtype_as_memorytype_const(type);
    printf("memory ");
    pwVar4 = (wasm_limits_t *)wasm_memorytype_limits(uVar3);
    print_limits(pwVar4);
    return;
  default:
    return;
  }
  print_valtype(type_00);
  return;
}

Assistant:

void print_externtype(const wasm_externtype_t* type) {
  switch (wasm_externtype_kind(type)) {
    case WASM_EXTERN_FUNC: {
      const wasm_functype_t* functype =
        wasm_externtype_as_functype_const(type);
      printf("func ");
      print_valtypes(wasm_functype_params(functype));
      printf(" -> ");
      print_valtypes(wasm_functype_results(functype));
    } break;
    case WASM_EXTERN_GLOBAL: {
      const wasm_globaltype_t* globaltype =
        wasm_externtype_as_globaltype_const(type);
      printf("global ");
      print_mutability(wasm_globaltype_mutability(globaltype));
      printf(" ");
      print_valtype(wasm_globaltype_content(globaltype));
    } break;
    case WASM_EXTERN_TABLE: {
      const wasm_tabletype_t* tabletype =
        wasm_externtype_as_tabletype_const(type);
      printf("table ");
      print_limits(wasm_tabletype_limits(tabletype));
      printf(" ");
      print_valtype(wasm_tabletype_element(tabletype));
    } break;
    case WASM_EXTERN_MEMORY: {
      const wasm_memorytype_t* memorytype =
        wasm_externtype_as_memorytype_const(type);
      printf("memory ");
      print_limits(wasm_memorytype_limits(memorytype));
    } break;
  }
}